

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O1

void __thiscall tli_window_manager::Text::Text(Text *this,int width,int height,string *initial_str)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  (this->super_Observer)._vptr_Observer = (_func_int **)&PTR___cxa_pure_virtual_00109da0;
  Box::Box(&this->super_Box);
  (this->super_Observer)._vptr_Observer = (_func_int **)&PTR_set_position_00109ca8;
  (this->super_Box)._vptr_Box = (_func_int **)&PTR_layout_00109ce8;
  paVar1 = &(this->buffer_).field_2;
  (this->buffer_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (initial_str->_M_dataplus)._M_p;
  paVar2 = &initial_str->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&initial_str->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->buffer_).field_2 + 8) = uVar4;
  }
  else {
    (this->buffer_)._M_dataplus._M_p = pcVar3;
    (this->buffer_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->buffer_)._M_string_length = initial_str->_M_string_length;
  (initial_str->_M_dataplus)._M_p = (pointer)paVar2;
  initial_str->_M_string_length = 0;
  (initial_str->field_2)._M_local_buf[0] = '\0';
  this->frame_width_ = width;
  this->frame_height_ = height;
  this->cursor_position_ = 0;
  this->index_ = 0;
  return;
}

Assistant:

Text::Text(int width, int height, std::string initial_str) : frame_width_{width}, buffer_{std::move(initial_str)},
                                                             frame_height_{height}, cursor_position_{0}, index_{0} {}